

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::ItemHoverable(ImRect *bb,ImGuiID id)

{
  ImGuiWindow *window_00;
  code *pcVar1;
  ImGuiContext *pIVar2;
  undefined1 uVar3;
  ImGuiID in_ESI;
  ImVec2 *unaff_retaddr;
  ImVec2 *in_stack_00000008;
  ImGuiItemFlags item_flags;
  ImGuiWindow *window;
  ImGuiContext *g;
  float in_stack_00000050;
  ImDrawFlags in_stack_00000054;
  float in_stack_00000058;
  ImU32 in_stack_0000005c;
  ImVec2 *in_stack_00000060;
  ImVec2 *in_stack_00000068;
  ImDrawList *in_stack_00000070;
  uint local_30;
  bool in_stack_ffffffffffffffff;
  bool bVar4;
  
  pIVar2 = GImGui;
  if (((GImGui->HoveredId == 0) || (GImGui->HoveredId == in_ESI)) ||
     ((GImGui->HoveredIdAllowOverlap & 1U) != 0)) {
    window_00 = GImGui->CurrentWindow;
    if (GImGui->HoveredWindow == window_00) {
      if (((GImGui->ActiveId == 0) || (GImGui->ActiveId == in_ESI)) ||
         ((GImGui->ActiveIdAllowOverlap & 1U) != 0)) {
        bVar4 = IsMouseHoveringRect(in_stack_00000008,unaff_retaddr,in_stack_ffffffffffffffff);
        if (bVar4) {
          bVar4 = IsWindowContentHoverable(window_00,0);
          if (bVar4) {
            if (in_ESI != 0) {
              SetHoveredID(in_ESI);
            }
            if ((pIVar2->LastItemData).ID == in_ESI) {
              local_30 = (pIVar2->LastItemData).InFlags;
            }
            else {
              local_30 = pIVar2->CurrentItemFlags;
            }
            if ((local_30 & 4) == 0) {
              if (in_ESI != 0) {
                if (((pIVar2->DebugItemPickerActive & 1U) != 0) &&
                   (pIVar2->HoveredIdPreviousFrame == in_ESI)) {
                  GetForegroundDrawList();
                  ImDrawList::AddRect(in_stack_00000070,in_stack_00000068,in_stack_00000060,
                                      in_stack_0000005c,in_stack_00000058,in_stack_00000054,
                                      in_stack_00000050);
                }
                if (pIVar2->DebugItemPickerBreakId == in_ESI) {
                  pcVar1 = (code *)swi(3);
                  uVar3 = (*pcVar1)();
                  return (bool)uVar3;
                }
              }
              if ((pIVar2->NavDisableMouseHover & 1U) == 0) {
                bVar4 = true;
              }
              else {
                bVar4 = false;
              }
            }
            else {
              if (pIVar2->ActiveId == in_ESI) {
                ClearActiveID();
              }
              pIVar2->HoveredIdDisabled = true;
              bVar4 = false;
            }
          }
          else {
            pIVar2->HoveredIdDisabled = true;
            bVar4 = false;
          }
        }
        else {
          bVar4 = false;
        }
      }
      else {
        bVar4 = false;
      }
    }
    else {
      bVar4 = false;
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ImGui::ItemHoverable(const ImRect& bb, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    if (g.HoveredId != 0 && g.HoveredId != id && !g.HoveredIdAllowOverlap)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (g.HoveredWindow != window)
        return false;
    if (g.ActiveId != 0 && g.ActiveId != id && !g.ActiveIdAllowOverlap)
        return false;
    if (!IsMouseHoveringRect(bb.Min, bb.Max))
        return false;
    if (!IsWindowContentHoverable(window, ImGuiHoveredFlags_None))
    {
        g.HoveredIdDisabled = true;
        return false;
    }

    // We exceptionally allow this function to be called with id==0 to allow using it for easy high-level
    // hover test in widgets code. We could also decide to split this function is two.
    if (id != 0)
        SetHoveredID(id);

    // When disabled we'll return false but still set HoveredId
    ImGuiItemFlags item_flags = (g.LastItemData.ID == id ? g.LastItemData.InFlags : g.CurrentItemFlags);
    if (item_flags & ImGuiItemFlags_Disabled)
    {
        // Release active id if turning disabled
        if (g.ActiveId == id)
            ClearActiveID();
        g.HoveredIdDisabled = true;
        return false;
    }

    if (id != 0)
    {
        // [DEBUG] Item Picker tool!
        // We perform the check here because SetHoveredID() is not frequently called (1~ time a frame), making
        // the cost of this tool near-zero. We can get slightly better call-stack and support picking non-hovered
        // items if we perform the test in ItemAdd(), but that would incur a small runtime cost.
        // #define IMGUI_DEBUG_TOOL_ITEM_PICKER_EX in imconfig.h if you want this check to also be performed in ItemAdd().
        if (g.DebugItemPickerActive && g.HoveredIdPreviousFrame == id)
            GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 255, 0, 255));
        if (g.DebugItemPickerBreakId == id)
            IM_DEBUG_BREAK();
    }

    if (g.NavDisableMouseHover)
        return false;

    return true;
}